

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac(mbedtls_md_info_t *md_info,uchar *key,size_t keylen,uchar *input,size_t ilen,
                   uchar *output)

{
  int local_5c;
  undefined1 local_58 [4];
  int ret;
  mbedtls_md_context_t ctx;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_md_info_t *md_info_local;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    md_info_local._4_4_ = -0x5100;
  }
  else {
    ctx.hmac_ctx = output;
    mbedtls_md_init((mbedtls_md_context_t *)local_58);
    local_5c = mbedtls_md_setup((mbedtls_md_context_t *)local_58,md_info,1);
    if (((local_5c == 0) &&
        (local_5c = mbedtls_md_hmac_starts((mbedtls_md_context_t *)local_58,key,keylen),
        local_5c == 0)) &&
       (local_5c = mbedtls_md_hmac_update((mbedtls_md_context_t *)local_58,input,ilen),
       local_5c == 0)) {
      local_5c = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_58,(uchar *)ctx.hmac_ctx);
    }
    mbedtls_md_free((mbedtls_md_context_t *)local_58);
    md_info_local._4_4_ = local_5c;
  }
  return md_info_local._4_4_;
}

Assistant:

int mbedtls_md_hmac( const mbedtls_md_info_t *md_info,
                     const unsigned char *key, size_t keylen,
                     const unsigned char *input, size_t ilen,
                     unsigned char *output )
{
    mbedtls_md_context_t ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 1 ) ) != 0 )
        goto cleanup;

    if( ( ret = mbedtls_md_hmac_starts( &ctx, key, keylen ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_hmac_update( &ctx, input, ilen ) ) != 0 )
        goto cleanup;
    if( ( ret = mbedtls_md_hmac_finish( &ctx, output ) ) != 0 )
        goto cleanup;

cleanup:
    mbedtls_md_free( &ctx );

    return( ret );
}